

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  Atom AVar2;
  Display *pDVar3;
  char *pcVar4;
  unsigned_long uVar5;
  Atom AVar6;
  long lVar7;
  Window WVar8;
  undefined8 uVar9;
  ulong uVar10;
  long *plVar11;
  size_t sVar12;
  undefined4 local_158 [2];
  XEvent reply;
  Atom targets [5];
  Atom local_68;
  Atom formats [3];
  
  AVar6 = 0;
  memset(local_158,0,0xc0);
  plVar11 = (long *)_glfw.x11.clipboardString;
  pDVar3 = _glfw.x11.display;
  formats[0] = _glfw.x11.COMPOUND_STRING;
  formats[1] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_001320f2;
  AVar2 = (event->xkey).time;
  if (AVar2 == _glfw.x11.TARGETS) {
    plVar11 = reply.pad + 0x17;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = _glfw.x11.COMPOUND_STRING;
    targets[3] = 0x1f;
    WVar8 = (event->xkey).root;
    uVar9 = 0x20;
    sVar12 = 5;
    AVar6 = 4;
    reply.pad[0x17] = AVar2;
LAB_00131fd8:
    XChangeProperty(pDVar3,WVar8,AVar1,AVar6,uVar9,0,plVar11,sVar12);
  }
  else {
    if (AVar2 != _glfw.x11.MULTIPLE) {
      if (AVar2 != _glfw.x11.SAVE_TARGETS) {
        AVar6 = 0;
        lVar7 = 0;
        do {
          if (AVar2 == formats[lVar7 + -1]) {
            WVar8 = (event->xkey).root;
            sVar12 = strlen(_glfw.x11.clipboardString);
            uVar9 = 8;
            AVar6 = AVar2;
            goto LAB_00131fd8;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        goto LAB_001320f2;
      }
      WVar8 = (event->xkey).root;
      uVar9 = 0x20;
      sVar12 = 0;
      plVar11 = (long *)0x0;
      AVar6 = _glfw.x11.NULL_;
      goto LAB_00131fd8;
    }
    uVar5 = _glfwGetWindowPropertyX11
                      ((event->xkey).root,AVar1,_glfw.x11.ATOM_PAIR,(uchar **)(reply.pad + 0x17));
    if (uVar5 != 0) {
      uVar10 = 0;
      do {
        pcVar4 = _glfw.x11.clipboardString;
        pDVar3 = _glfw.x11.display;
        AVar1 = *(Atom *)(reply.pad[0x17] + uVar10 * 8);
        lVar7 = 0;
        do {
          if (AVar1 == formats[lVar7 + -1]) {
            WVar8 = (event->xkey).root;
            uVar9 = *(undefined8 *)(reply.pad[0x17] + 8 + uVar10 * 8);
            sVar12 = strlen(_glfw.x11.clipboardString);
            XChangeProperty(pDVar3,WVar8,uVar9,AVar1,8,0,pcVar4,sVar12);
            goto LAB_0013209a;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        *(undefined8 *)(reply.pad[0x17] + 8 + uVar10 * 8) = 0;
LAB_0013209a:
        uVar10 = uVar10 + 2;
      } while (uVar10 < uVar5);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,reply.pad[0x17],uVar5);
    XFree(reply.pad[0x17]);
  }
  AVar6 = (event->xselectionrequest).property;
LAB_001320f2:
  local_158[0] = 0x1f;
  reply.xerror.resourceid = (XID)(event->xany).display;
  reply.xany.display = (Display *)(event->xkey).root;
  reply.xany.window = (event->xkey).subwindow;
  reply.xkey.root = (event->xkey).time;
  reply.xkey.time = (event->xconfigure).above;
  reply.xkey.subwindow = AVar6;
  XSendEvent(_glfw.x11.display,reply.xany.display,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}